

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenuPrivate::hideMenu(QMenuPrivate *this,QMenu *menu)

{
  long lVar1;
  long *plVar2;
  Data *pDVar3;
  int *piVar4;
  int iVar5;
  int *piVar6;
  QStyle *pQVar7;
  QObject *pQVar8;
  QMenu *pQVar9;
  QAction *pQVar10;
  uint uVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [16];
  QMenu *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (menu == (QMenu *)0x0) goto LAB_00456161;
  piVar6 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)menu);
  uVar11 = *(uint *)(*(long *)&(menu->super_QWidget).field_0x8 + 0x30);
  QObject::blockSignals(SUB81(menu,0));
  this->field_0x421 = this->field_0x421 | 1;
  pQVar7 = QWidget::style(&menu->super_QWidget);
  if (piVar6 == (int *)0x0) {
    pQVar9 = (QMenu *)0x0;
  }
  else {
    pQVar9 = (QMenu *)0x0;
    if (piVar6[1] != 0) {
      pQVar9 = menu;
    }
  }
  iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x51,0,pQVar9);
  if ((iVar5 == 0) || (this->currentAction == (QAction *)0x0)) {
LAB_0045609e:
    this->field_0x421 = this->field_0x421 & 0xfe;
    if (piVar6 == (int *)0x0) goto LAB_00456161;
LAB_004560af:
    if (piVar6[1] != 0) {
      uVar11 = (uVar11 & 2) >> 1;
      QObject::blockSignals(SUB81(menu,0));
      pDVar3 = (this->activeMenu).wp.d;
      if (pDVar3 != (Data *)0x0) {
        if (*(int *)(pDVar3 + 4) == 0) {
          pQVar8 = (QObject *)0x0;
        }
        else {
          pQVar8 = (this->activeMenu).wp.value;
        }
        if (pQVar8 == (QObject *)menu) {
          (this->activeMenu).wp.d = (Data *)0x0;
          (this->activeMenu).wp.value = (QObject *)0x0;
          LOCK();
          *(int *)pDVar3 = *(int *)pDVar3 + -1;
          UNLOCK();
          if (*(int *)pDVar3 == 0) {
            operator_delete(pDVar3);
          }
        }
      }
      lVar12 = *(long *)&(menu->super_QWidget).field_0x8;
      piVar4 = *(int **)(lVar12 + 0x308);
      *(undefined8 *)(lVar12 + 0x308) = 0;
      *(undefined8 *)(lVar12 + 0x310) = 0;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          operator_delete(piVar4);
        }
      }
      QWidget::close(&menu->super_QWidget,uVar11);
      lVar12 = *(long *)&(menu->super_QWidget).field_0x8;
      piVar4 = *(int **)(lVar12 + 0x2f8);
      *(undefined8 *)(lVar12 + 0x2f8) = 0;
      *(undefined8 *)(lVar12 + 0x300) = 0;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          operator_delete(piVar4);
        }
      }
    }
  }
  else {
    pDVar3 = (this->actionAboutToTrigger).wp.d;
    if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
      pQVar10 = (QAction *)0x0;
    }
    else {
      pQVar10 = (QAction *)(this->actionAboutToTrigger).wp.value;
    }
    if (pQVar10 != this->currentAction) goto LAB_0045609e;
    QWidget::actions((QList<QAction_*> *)local_58,&menu->super_QWidget);
    if (local_48 == (QMenu *)0x0) {
LAB_00455f6f:
      bVar13 = false;
    }
    else {
      lVar12 = 0;
      do {
        if ((long)local_48 << 3 == lVar12) goto LAB_00455f6f;
        lVar1 = lVar12 + 8;
        plVar2 = (long *)(local_58._8_8_ + lVar12);
        lVar12 = lVar1;
      } while ((QAction *)*plVar2 != this->currentAction);
      bVar13 = lVar1 != 0;
    }
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,8,0x10);
      }
    }
    if (!bVar13) goto LAB_0045609e;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEventLoop::QEventLoop((QEventLoop *)&local_68,(QObject *)0x0);
    pQVar10 = this->currentAction;
    setCurrentAction(*(QMenuPrivate **)&(menu->super_QWidget).field_0x8,(QAction *)0x0,0,
                     SelectedFromElsewhere,false);
    local_48 = (QMenu *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QObject::QObject((QObject *)local_58,(QObject *)0x0);
    local_58._0_8_ = &PTR_metaObject_007f75b8;
    puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
    local_48 = menu;
    QObject::installEventFilter((QObject *)menu);
    QTimer::singleShot(60000000,0,(QEventLoop *)&local_68,"1quit()");
    QEventLoop::exec((QEventLoop *)&local_68,0);
    if (piVar6 == (int *)0x0) {
      hideMenu::Reposter::~Reposter((Reposter *)local_58);
      QEventLoop::~QEventLoop((QEventLoop *)&local_68);
      goto LAB_00456161;
    }
    if (piVar6[1] != 0) {
      QMenu::setActiveAction(menu,pQVar10);
      QTimer::singleShot(20000000,0,(QEventLoop *)&local_68,"1quit()");
      QEventLoop::exec((QEventLoop *)&local_68,0);
      hideMenu::Reposter::~Reposter((Reposter *)local_58);
      QEventLoop::~QEventLoop((QEventLoop *)&local_68);
      this->field_0x421 = this->field_0x421 & 0xfe;
      goto LAB_004560af;
    }
    hideMenu::Reposter::~Reposter((Reposter *)local_58);
    QEventLoop::~QEventLoop((QEventLoop *)&local_68);
    if (piVar6 == (int *)0x0) goto LAB_00456161;
  }
  LOCK();
  *piVar6 = *piVar6 + -1;
  UNLOCK();
  if (*piVar6 == 0) {
    operator_delete(piVar6);
  }
LAB_00456161:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::hideMenu(QMenu *menu)
{
    if (!menu)
        return;

    // See two execs below. They may trigger an akward situation
    // when 'menu' (also known as 'q' or 'this' in the many functions
    // around) to become a dangling pointer if the loop manages
    // to execute 'deferred delete' ... posted while executing
    // this same loop. Not good!
    struct Reposter : QObject
    {
        Reposter(QMenu *menu) : q(menu)
        {
            Q_ASSERT(q);
            q->installEventFilter(this);
        }
        ~Reposter()
        {
            if (deleteLater)
                q->deleteLater();
        }
        bool eventFilter(QObject *obj, QEvent *event) override
        {
            if (obj == q && event->type() == QEvent::DeferredDelete)
                return deleteLater = true;

            return QObject::eventFilter(obj, event);
        }
        QMenu *q = nullptr;
        bool deleteLater = false;
    };

#if QT_CONFIG(effects)
    // If deleteLater has been called and the event loop spins, while waiting
    // for visual effects to happen, menu might become stale.
    // To prevent a QSignalBlocker from restoring a stale object, block and restore signals manually.
    QPointer<QMenu> stillAlive(menu);
    const bool signalsBlocked = menu->signalsBlocked();
    menu->blockSignals(true);

    aboutToHide = true;
    // Flash item which is about to trigger (if any).
    if (menu && menu->style()->styleHint(QStyle::SH_Menu_FlashTriggeredItem, nullptr, stillAlive)
        && currentAction && currentAction == actionAboutToTrigger
        && menu->actions().contains(currentAction)) {
        QEventLoop eventLoop;
        QAction *activeAction = currentAction;

        menu->setActiveAction(nullptr);
        const Reposter deleteDeleteLate(menu);
        QTimer::singleShot(60, &eventLoop, SLOT(quit()));
        eventLoop.exec();

        if (!stillAlive)
            return;

        // Select and wait 20 ms.
        menu->setActiveAction(activeAction);
        QTimer::singleShot(20, &eventLoop, SLOT(quit()));
        eventLoop.exec();
    }

    aboutToHide = false;

    if (stillAlive)
        menu->blockSignals(signalsBlocked);
    else
        return;

#endif // QT_CONFIG(effects)
    if (activeMenu == menu)
        activeMenu = nullptr;

    menu->d_func()->causedPopup.action = nullptr;
    menu->close();
    menu->d_func()->causedPopup.widget = nullptr;
}